

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_EQ_RANGE_Array_Test::iu_AssertionTest_x_iutest_x_EQ_RANGE_Array_Test
          (iu_AssertionTest_x_iutest_x_EQ_RANGE_Array_Test *this)

{
  iu_AssertionTest_x_iutest_x_EQ_RANGE_Array_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_AssertionTest_x_iutest_x_EQ_RANGE_Array_Test_00237f30;
  return;
}

Assistant:

IUTEST(AssertionTest, EQ_RANGE_Array)
{
    int  a[] = { 0, 1, 2, 3, 4 };
    int  b[] = { 0, 1, 2, 3, 4 };
    char c[] = { 0, 1, 2, 3, 4 };

    IUTEST_ASSERT_EQ_RANGE(a, b);
    IUTEST_EXPECT_EQ_RANGE(a, b);
    IUTEST_INFORM_EQ_RANGE(a, b);
    IUTEST_ASSUME_EQ_RANGE(a, b);

    IUTEST_ASSERT_EQ_RANGE(a, c);
    IUTEST_EXPECT_EQ_RANGE(a, c);
    IUTEST_INFORM_EQ_RANGE(a, c);
    IUTEST_ASSUME_EQ_RANGE(a, c);
#if IUTEST_HAS_INITIALIZER_LIST
    IUTEST_ASSERT_EQ_RANGE(::std::initializer_list<int>({0, 1, 2, 3, 4}), a);
#if IUTEST_HAS_AUTO
    auto il = {0, 1, 2, 3, 4};
    IUTEST_ASSERT_EQ_RANGE(il, a);
#endif
#endif
}